

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  int iVar2;
  abctime aVar3;
  int *__ptr;
  abctime aVar4;
  abctime time;
  char *pcVar5;
  char *pcVar6;
  Abc_Ntk_t *local_98;
  Abc_Ntk_t *local_90;
  Prove_Params_t Params;
  
  local_90 = Abc_FrameReadNtk(pAbc);
  Prove_ParamsSetDefault(&Params);
  Extra_UtilGetoptReset();
LAB_00202792:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"NCFGLIrfbvh");
    pNtk = local_90;
    iVar2 = globalUtilOptind;
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00202928:
        Abc_Print(-1,pcVar5);
        goto switchD_002027ae_caseD_44;
      }
      Params.nMiteringLimitStart = atoi(argv[globalUtilOptind]);
      iVar1 = Params.nMiteringLimitStart;
      break;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
      goto switchD_002027ae_caseD_44;
    case 0x46:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_00202928;
      }
      Params.nFraigingLimitStart = atoi(argv[globalUtilOptind]);
      iVar1 = Params.nFraigingLimitStart;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-G\" should be followed by an integer.\n";
        goto LAB_00202928;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Params.nFraigingLimitMulti = (float)iVar1;
      break;
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_00202928;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Params.nTotalInspectLimit = (ABC_INT64_T)iVar1;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_00202928;
      }
      Params.nMiteringLimitLast = atoi(argv[globalUtilOptind]);
      iVar1 = Params.nMiteringLimitLast;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_00202928;
      }
      Params.nItersMax = atoi(argv[globalUtilOptind]);
      iVar1 = Params.nItersMax;
      break;
    default:
      if (iVar1 == 0x62) {
        Params.fUseBdds = Params.fUseBdds ^ 1;
      }
      else if (iVar1 == 0x66) {
        Params.fUseFraiging = Params.fUseFraiging ^ 1;
      }
      else if (iVar1 == 0x72) {
        Params.fUseRewriting = Params.fUseRewriting ^ 1;
      }
      else {
        if (iVar1 != 0x76) {
          if (iVar1 == -1) {
            if (local_90 != (Abc_Ntk_t *)0x0) {
              if (local_90->nObjCounts[8] < 1) {
                if (local_90->vCos->nSize == 1) {
                  aVar3 = Abc_Clock();
                  if (pNtk->ntkType == ABC_NTK_STRASH) {
                    local_98 = Abc_NtkDup(pNtk);
                  }
                  else {
                    local_98 = Abc_NtkStrash(pNtk,0,0,0);
                  }
                  iVar2 = Abc_NtkMiterProve(&local_98,&Params);
                  if (iVar2 == 0) {
                    __ptr = Abc_NtkVerifySimulatePattern(pNtk,local_98->pModel);
                    if (*__ptr != 1) {
                      Abc_Print(1,
                                "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n"
                               );
                    }
                    free(__ptr);
                    pAbc->Status = 0;
                    pcVar5 = "SATISFIABLE    ";
                  }
                  else {
                    pAbc->Status = iVar2;
                    pcVar5 = "UNSATISFIABLE  ";
                    if (iVar2 == -1) {
                      pcVar5 = "UNDECIDED      ";
                    }
                  }
                  Abc_Print(1,pcVar5);
                  aVar4 = Abc_Clock();
                  Abc_PrintTime((int)aVar4 - (int)aVar3,pcVar5,time);
                  Abc_FrameReplaceCurrentNetwork(pAbc,local_98);
                  return 0;
                }
                pcVar5 = "Currently can only solve the miter with one output.\n";
              }
              else {
                pcVar5 = "Currently can only solve the miter for combinational circuits.\n";
              }
              Abc_Print(-1,pcVar5);
              return 0;
            }
            pcVar5 = "Empty network.\n";
            iVar2 = -1;
            goto LAB_00202a76;
          }
          goto switchD_002027ae_caseD_44;
        }
        Params.fVerbose = Params.fVerbose ^ 1;
      }
      goto LAB_00202792;
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_002027ae_caseD_44:
      iVar2 = -2;
      Abc_Print(-2,"usage: prove [-NCFGLI num] [-rfbvh]\n");
      Abc_Print(-2,"\t         solves combinational miter by rewriting, FRAIGing, and SAT\n");
      Abc_Print(-2,"\t         replaces the current network by the cone modified by rewriting\n");
      Abc_Print(-2,"\t         (there is also newer CEC command \"iprove\")\n");
      Abc_Print(-2,"\t-N num : max number of iterations [default = %d]\n",
                (ulong)(uint)Params.nItersMax);
      Abc_Print(-2,"\t-C num : max starting number of conflicts in mitering [default = %d]\n",
                (ulong)(uint)Params.nMiteringLimitStart);
      Abc_Print(-2,"\t-F num : max starting number of conflicts in fraiging [default = %d]\n",
                (ulong)(uint)Params.nFraigingLimitStart);
      Abc_Print(-2,"\t-G num : multiplicative coefficient for fraiging [default = %d]\n",
                (ulong)(uint)(int)Params.nFraigingLimitMulti);
      Abc_Print(-2,"\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n",
                (ulong)(uint)Params.nMiteringLimitLast);
      Abc_Print(-2,"\t-I num : max number of clause inspections in all SAT calls [default = %d]\n",
                Params.nTotalInspectLimit & 0xffffffff);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (Params.fUseRewriting == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Params.fUseFraiging == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle the use of FRAIGing [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Params.fUseBdds == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle the use of BDDs [default = %s]\n",pcVar5);
      if (Params.fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_00202a76:
      Abc_Print(iVar2,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp;
    Prove_Params_t Params, * pParams = &Params;
    int c, RetValue;
    abctime clk;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Prove_ParamsSetDefault( pParams );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCFGLIrfbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nItersMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitMulti = (float)atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitMulti < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitLast = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitLast < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nTotalInspectLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nTotalInspectLimit < 0 )
                goto usage;
            break;
        case 'r':
            pParams->fUseRewriting ^= 1;
            break;
        case 'f':
            pParams->fUseFraiging ^= 1;
            break;
        case 'b':
            pParams->fUseBdds ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }
    if ( Abc_NtkCoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently can only solve the miter with one output.\n" );
        return 0;
    }
    clk = Abc_Clock();

    if ( Abc_NtkIsStrash(pNtk) )
        pNtkTemp = Abc_NtkDup( pNtk );
    else
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );

    RetValue = Abc_NtkMiterProve( &pNtkTemp, pParams );

    // verify that the pattern is correct
    if ( RetValue == 0 )
    {
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtkTemp->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
        ABC_FREE( pSimInfo );
    }
    pAbc->Status = RetValue;
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: prove [-NCFGLI num] [-rfbvh]\n" );
    Abc_Print( -2, "\t         solves combinational miter by rewriting, FRAIGing, and SAT\n" );
    Abc_Print( -2, "\t         replaces the current network by the cone modified by rewriting\n" );
    Abc_Print( -2, "\t         (there is also newer CEC command \"iprove\")\n" );
    Abc_Print( -2, "\t-N num : max number of iterations [default = %d]\n", pParams->nItersMax );
    Abc_Print( -2, "\t-C num : max starting number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitStart );
    Abc_Print( -2, "\t-F num : max starting number of conflicts in fraiging [default = %d]\n", pParams->nFraigingLimitStart );
    Abc_Print( -2, "\t-G num : multiplicative coefficient for fraiging [default = %d]\n", (int)pParams->nFraigingLimitMulti );
    Abc_Print( -2, "\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitLast );
    Abc_Print( -2, "\t-I num : max number of clause inspections in all SAT calls [default = %d]\n", (int)pParams->nTotalInspectLimit );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", pParams->fUseRewriting? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle the use of FRAIGing [default = %s]\n", pParams->fUseFraiging? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle the use of BDDs [default = %s]\n", pParams->fUseBdds? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}